

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

xmlHashTablePtr xmlHashCreate(int size)

{
  uint uVar1;
  int iVar2;
  uint local_24;
  uint newSize;
  xmlHashTablePtr hash;
  xmlHashTablePtr pxStack_10;
  int size_local;
  
  xmlInitParser();
  pxStack_10 = (xmlHashTablePtr)(*xmlMalloc)(0x20);
  if (pxStack_10 == (xmlHashTablePtr)0x0) {
    pxStack_10 = (xmlHashTablePtr)0x0;
  }
  else {
    pxStack_10->dict = (xmlDictPtr)0x0;
    pxStack_10->size = 0;
    pxStack_10->table = (xmlHashEntry *)0x0;
    pxStack_10->nbElems = 0;
    uVar1 = xmlRandom();
    pxStack_10->randomSeed = uVar1;
    if (8 < size) {
      for (local_24 = 0x10; local_24 < (uint)size && local_24 < 0x80000000; local_24 = local_24 << 1
          ) {
      }
      iVar2 = xmlHashGrow(pxStack_10,local_24);
      if (iVar2 != 0) {
        (*xmlFree)(pxStack_10);
        pxStack_10 = (xmlHashTablePtr)0x0;
      }
    }
  }
  return pxStack_10;
}

Assistant:

xmlHashTablePtr
xmlHashCreate(int size) {
    xmlHashTablePtr hash;

    xmlInitParser();

    hash = xmlMalloc(sizeof(*hash));
    if (hash == NULL)
        return(NULL);
    hash->dict = NULL;
    hash->size = 0;
    hash->table = NULL;
    hash->nbElems = 0;
    hash->randomSeed = xmlRandom();
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    hash->randomSeed = 0;
#endif

    /*
     * Unless a larger size is passed, the backing table is created
     * lazily with MIN_HASH_SIZE capacity. In practice, there are many
     * hash tables which are never filled.
     */
    if (size > MIN_HASH_SIZE) {
        unsigned newSize = MIN_HASH_SIZE * 2;

        while ((newSize < (unsigned) size) && (newSize < MAX_HASH_SIZE))
            newSize *= 2;

        if (xmlHashGrow(hash, newSize) != 0) {
            xmlFree(hash);
            return(NULL);
        }
    }

    return(hash);
}